

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::appendCutsToModel(HighsPostsolveStack *this,HighsInt numCuts)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)(this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  std::vector<int,_std::allocator<int>_>::resize(&this->origRowIndex,lVar4 + numCuts);
  if (numCuts != 0) {
    piVar2 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      iVar1 = this->origNumRow;
      this->origNumRow = iVar1 + 1;
      piVar2[lVar4 + lVar3] = iVar1;
      lVar3 = lVar3 + 1;
    } while (numCuts != lVar3);
  }
  return;
}

Assistant:

void appendCutsToModel(HighsInt numCuts) {
    size_t currNumRow = origRowIndex.size();
    size_t newNumRow = currNumRow + numCuts;
    origRowIndex.resize(newNumRow);
    for (size_t i = currNumRow; i != newNumRow; ++i)
      origRowIndex[i] = origNumRow++;
  }